

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

void __thiscall
RVO::RVOSimulator::RVOSimulator
          (RVOSimulator *this,float timeStep,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  KdTree *this_00;
  Agent *this_01;
  Vector2 *velocity_local;
  float maxSpeed_local;
  float radius_local;
  float timeHorizonObst_local;
  float timeHorizon_local;
  size_t maxNeighbors_local;
  float neighborDist_local;
  float timeStep_local;
  RVOSimulator *this_local;
  
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::vector(&this->agents_);
  this->defaultAgent_ = (Agent *)0x0;
  this->globalTime_ = 0.0;
  this->kdTree_ = (KdTree *)0x0;
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::vector(&this->obstacles_);
  this->timeStep_ = timeStep;
  this_00 = (KdTree *)operator_new(0x40);
  KdTree::KdTree(this_00,this);
  this->kdTree_ = this_00;
  this_01 = (Agent *)operator_new(0x98);
  Agent::Agent(this_01,this);
  this->defaultAgent_ = this_01;
  this->defaultAgent_->maxNeighbors_ = maxNeighbors;
  this->defaultAgent_->maxSpeed_ = maxSpeed;
  this->defaultAgent_->neighborDist_ = neighborDist;
  this->defaultAgent_->radius_ = radius;
  this->defaultAgent_->timeHorizon_ = timeHorizon;
  this->defaultAgent_->timeHorizonObst_ = timeHorizonObst;
  this->defaultAgent_->velocity_ = *velocity;
  return;
}

Assistant:

RVOSimulator::RVOSimulator(float timeStep, float neighborDist, size_t maxNeighbors, float timeHorizon, float timeHorizonObst, float radius, float maxSpeed, const Vector2 &velocity) : defaultAgent_(NULL), globalTime_(0.0f), kdTree_(NULL), timeStep_(timeStep)
	{
		kdTree_ = new KdTree(this);
		defaultAgent_ = new Agent(this);

		defaultAgent_->maxNeighbors_ = maxNeighbors;
		defaultAgent_->maxSpeed_ = maxSpeed;
		defaultAgent_->neighborDist_ = neighborDist;
		defaultAgent_->radius_ = radius;
		defaultAgent_->timeHorizon_ = timeHorizon;
		defaultAgent_->timeHorizonObst_ = timeHorizonObst;
		defaultAgent_->velocity_ = velocity;
	}